

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall polyscope::SurfaceMesh::prepare(SurfaceMesh *this)

{
  ShaderProgram *program;
  Engine *pEVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_a3;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pEVar1 = render::engine;
  std::__cxx11::string::string((string *)&local_a0,"MESH",&local_a1);
  std::__cxx11::string::string((string *)&local_40,"SHADE_BASECOLOR",&local_a2);
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,__l,&local_a3);
  addStructureRules(&local_58,this,&local_70);
  (*pEVar1->_vptr_Engine[0x23])(&local_80,pEVar1,&local_a0,&local_58,0);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->program).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             &local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  fillGeometryBuffers(this,(this->program).
                           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
  pEVar1 = render::engine;
  program = (this->program).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_a0,(string *)&(this->material).value);
  render::Engine::setMaterial(pEVar1,program,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void SurfaceMesh::prepare() {
  program = render::engine->requestShader("MESH", addStructureRules({"SHADE_BASECOLOR"}));

  // Populate draw buffers
  fillGeometryBuffers(*program);
  render::engine->setMaterial(*program, getMaterial());
}